

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O1

LY_ERR lyplg_type_identity_isderived(lysc_ident *base,lysc_ident *der)

{
  lysc_ident **pplVar1;
  LY_ERR LVar2;
  lysc_ident *plVar3;
  lysc_ident *plVar4;
  
  if (base->module->ctx != der->module->ctx) {
    __assert_fail("base->module->ctx == der->module->ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types.c"
                  ,0x38f,
                  "LY_ERR lyplg_type_identity_isderived(const struct lysc_ident *, const struct lysc_ident *)"
                 );
  }
  plVar4 = (lysc_ident *)0x0;
  do {
    pplVar1 = base->derived;
    if (pplVar1 == (lysc_ident **)0x0) {
      plVar3 = (lysc_ident *)0x0;
    }
    else {
      plVar3 = pplVar1[-1];
    }
    if (plVar3 <= plVar4) {
      return LY_ENOTFOUND;
    }
    if (pplVar1[(long)plVar4] == der) {
      return LY_SUCCESS;
    }
    LVar2 = lyplg_type_identity_isderived(pplVar1[(long)plVar4],der);
    plVar4 = (lysc_ident *)((long)&plVar4->name + 1);
  } while (LVar2 != LY_SUCCESS);
  return LY_SUCCESS;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_identity_isderived(const struct lysc_ident *base, const struct lysc_ident *der)
{
    LY_ARRAY_COUNT_TYPE u;

    assert(base->module->ctx == der->module->ctx);

    LY_ARRAY_FOR(base->derived, u) {
        if (der == base->derived[u]) {
            return LY_SUCCESS;
        }
        if (!lyplg_type_identity_isderived(base->derived[u], der)) {
            return LY_SUCCESS;
        }
    }
    return LY_ENOTFOUND;
}